

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

RPCHelpMan * estimaterawfee(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe278;
  allocator<RPCResult> *paVar2;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffe280;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe290;
  string *in_stack_ffffffffffffe2a8;
  string *in_stack_ffffffffffffe2b0;
  UniValue *in_stack_ffffffffffffe2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe2c0;
  undefined7 in_stack_ffffffffffffe2c8;
  undefined1 in_stack_ffffffffffffe2cf;
  string *in_stack_ffffffffffffe2d0;
  undefined7 in_stack_ffffffffffffe2d8;
  undefined1 in_stack_ffffffffffffe2df;
  undefined4 in_stack_ffffffffffffe2e0;
  Type in_stack_ffffffffffffe2e4;
  string *in_stack_ffffffffffffe2e8;
  undefined4 in_stack_ffffffffffffe2f0;
  Type in_stack_ffffffffffffe2f4;
  undefined4 in_stack_ffffffffffffe2f8;
  Type in_stack_ffffffffffffe2fc;
  RPCResult *in_stack_ffffffffffffe300;
  RPCExamples *in_stack_ffffffffffffe3c0;
  RPCResults *in_stack_ffffffffffffe3c8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe3d0;
  string *in_stack_ffffffffffffe3d8;
  undefined1 *puVar3;
  string *in_stack_ffffffffffffe3e0;
  RPCHelpMan *in_stack_ffffffffffffe3e8;
  undefined1 *local_1c08;
  undefined1 *local_1bf0;
  undefined1 *local_1bd8;
  undefined1 *local_1bc0;
  undefined1 *local_1ba8;
  undefined1 *local_1b90;
  undefined1 *local_1b78;
  RPCMethodImpl *fun;
  undefined1 local_17c0 [37];
  allocator<char> local_179b [3];
  pointer local_1798;
  pointer pRStack_1790;
  pointer local_1788;
  allocator<char> local_177a;
  allocator<char> local_1779 [30];
  allocator<char> local_175b;
  RPCMethodImpl local_175a;
  allocator<char> local_173a;
  allocator<char> local_1739 [29];
  allocator<char> local_171c;
  allocator<char> local_171b [3];
  size_type local_1718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1710;
  allocator<char> local_16fa;
  allocator<char> local_16f9 [30];
  allocator<char> local_16db;
  allocator<char> local_16da [2];
  pointer local_16d8;
  pointer pbStack_16d0;
  pointer local_16c8;
  allocator<char> local_16ba;
  allocator<char> local_16b9 [30];
  allocator<char> local_169b;
  allocator<char> local_169a [2];
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  allocator<char> local_167a;
  allocator<char> local_1679;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  allocator<char> local_165a;
  allocator<char> local_1659;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  allocator<char> local_163a;
  allocator<char> local_1639;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  allocator<char> local_161a;
  allocator<char> local_1619;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  allocator<char> local_15fa;
  allocator<char> local_15f9;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  allocator<char> local_15da;
  allocator<char> local_15d9 [31];
  allocator<char> local_15ba;
  allocator<char> local_15b9;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  allocator<char> local_159a;
  allocator<char> local_1599;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  allocator<char> local_157a;
  allocator<char> local_1579;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  allocator<char> local_1559 [31];
  allocator<char> local_153a;
  allocator<char> local_1539 [31];
  allocator<char> local_151a;
  allocator<char> local_1519 [32];
  allocator<char> local_14f9;
  undefined8 local_14f8;
  allocator<char> local_14ea;
  allocator<char> local_14e9;
  undefined4 local_14e8;
  allocator<char> local_14e1 [31];
  allocator<char> local_14c2;
  allocator<char> local_14c1 [193];
  undefined1 local_1400 [136];
  undefined1 local_1378 [128];
  undefined1 local_12f8 [136];
  undefined1 local_1270 [128];
  undefined1 local_11f0 [136];
  undefined1 local_1168 [128];
  undefined1 local_10e8 [136];
  undefined1 local_1060 [96];
  undefined8 local_1000;
  undefined1 local_ea0 [816];
  undefined1 local_b70 [288];
  undefined1 local_a50 [816];
  undefined1 local_720 [64];
  undefined1 local_6e0 [408];
  undefined1 local_548 [200];
  undefined1 local_480;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined1 local_43f;
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_14e8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe288,&in_stack_ffffffffffffe280->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe290);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe278);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
                 in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
                 in_stack_ffffffffffffe2d0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_14f8 = 0x3fee666666666666;
  UniValue::UniValue<double,_double,_true>
            (in_stack_ffffffffffffe2b8,(double *)in_stack_ffffffffffffe2b0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe288,in_stack_ffffffffffffe280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_480 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe290);
  local_458 = 0;
  uStack_450 = 0;
  local_448 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe278);
  local_440 = 0;
  local_43f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
                 in_stack_ffffffffffffe2e8,in_stack_ffffffffffffe2e4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
                 in_stack_ffffffffffffe2d0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe278);
  __l._M_len._0_7_ = in_stack_ffffffffffffe2c8;
  __l._M_array = (iterator)in_stack_ffffffffffffe2c0;
  __l._M_len._7_1_ = in_stack_ffffffffffffe2cf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe2b8,__l,
             (allocator_type *)in_stack_ffffffffffffe2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
                 in_stack_ffffffffffffe2c0);
  std::operator+(in_stack_ffffffffffffe290,(char *)in_stack_ffffffffffffe288);
  local_1578 = 0;
  uStack_1570 = 0;
  local_1568 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe278);
  paVar2 = (allocator<RPCResult> *)((ulong)in_stack_ffffffffffffe278 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2fc,in_stack_ffffffffffffe2f8),
             in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2e8,
             SUB41(in_stack_ffffffffffffe2e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2d0,
             (bool)in_stack_ffffffffffffe2cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_1598 = 0;
  uStack_1590 = 0;
  local_1588 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_15b8 = 0;
  uStack_15b0 = 0;
  local_15a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_15f8 = 0;
  uStack_15f0 = 0;
  local_15e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_1618 = 0;
  uStack_1610 = 0;
  local_1608 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_1638 = 0;
  uStack_1630 = 0;
  local_1628 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_1658 = 0;
  uStack_1650 = 0;
  local_1648 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_1678 = 0;
  uStack_1670 = 0;
  local_1668 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_1698 = 0;
  uStack_1690 = 0;
  local_1688 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe2c8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe2c0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe2cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2b8,__l_00,
             (allocator_type *)in_stack_ffffffffffffe2b0);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2fc,in_stack_ffffffffffffe2f8),
             in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2e8,
             SUB41(in_stack_ffffffffffffe2e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2d0,
             (bool)in_stack_ffffffffffffe2cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_16d8 = (pointer)0x0;
  pbStack_16d0 = (pointer)0x0;
  local_16c8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe2c8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe2c0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe2cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2b8,__l_01,
             (allocator_type *)in_stack_ffffffffffffe2b0);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2fc,in_stack_ffffffffffffe2f8),
             in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2e8,
             SUB41(in_stack_ffffffffffffe2e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2d0,
             (bool)in_stack_ffffffffffffe2cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_1718 = 0;
  aStack_1710._M_allocated_capacity = 0;
  aStack_1710._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe2c8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe2c0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe2cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2b8,__l_02,
             (allocator_type *)in_stack_ffffffffffffe2b0);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2fc,in_stack_ffffffffffffe2f8),
             in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2e8,
             SUB41(in_stack_ffffffffffffe2e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2d0,
             (bool)in_stack_ffffffffffffe2cf);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe2c8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe2c0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe2cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2b8,__l_03,
             (allocator_type *)in_stack_ffffffffffffe2b0);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2fc,in_stack_ffffffffffffe2f8),
             in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2e8,
             SUB41(in_stack_ffffffffffffe2e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2d0,
             (bool)in_stack_ffffffffffffe2cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_175a.super__Function_base._M_functor._2_8_ = 0;
  local_175a.super__Function_base._10_8_ = 0;
  local_175a._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffe2c8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe2c0;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffe2cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2b8,__l_04,
             (allocator_type *)in_stack_ffffffffffffe2b0);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2fc,in_stack_ffffffffffffe2f8),
             in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2e8,
             SUB41(in_stack_ffffffffffffe2e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2d0,
             (bool)in_stack_ffffffffffffe2cf);
  fun = &local_175a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  local_1798 = (pointer)0x0;
  pRStack_1790 = (pointer)0x0;
  local_1788 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffe2c8;
  __l_05._M_array = (iterator)in_stack_ffffffffffffe2c0;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffe2cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2b8,__l_05,
             (allocator_type *)in_stack_ffffffffffffe2b0);
  paVar2 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe2fc,in_stack_ffffffffffffe2f8),
             in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2e8,
             SUB41(in_stack_ffffffffffffe2e4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe2df,in_stack_ffffffffffffe2d8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2d0,
             (bool)in_stack_ffffffffffffe2cf);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffe2c8;
  __l_06._M_array = (iterator)in_stack_ffffffffffffe2c0;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffe2cf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe2b8,__l_06,
             (allocator_type *)in_stack_ffffffffffffe2b0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe300,in_stack_ffffffffffffe2fc,
             (string *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0),
             in_stack_ffffffffffffe2e8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe2e4,in_stack_ffffffffffffe2e0),
             (bool)in_stack_ffffffffffffe2df);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe2fc,in_stack_ffffffffffffe2f8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe2f4,in_stack_ffffffffffffe2f0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe2cf,in_stack_ffffffffffffe2c8),
             (char *)in_stack_ffffffffffffe2c0,(allocator<char> *)in_stack_ffffffffffffe2b8);
  HelpExampleCli(in_stack_ffffffffffffe2b0,in_stack_ffffffffffffe2a8);
  RPCExamples::RPCExamples((RPCExamples *)paVar2,(string *)0x12e5b2a);
  this = (RPCArg *)local_17c0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<estimaterawfee()::__0,void>
            (in_stack_ffffffffffffe288,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe280);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e0,in_stack_ffffffffffffe3d8,
             in_stack_ffffffffffffe3d0,in_stack_ffffffffffffe3c8,in_stack_ffffffffffffe3c0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_17c0 + 0x24));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_179b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1b78 = local_548;
  do {
    local_1b78 = local_1b78 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1b78 != local_6e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1b90 = local_1378;
  do {
    local_1b90 = local_1b90 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1b90 != local_1400);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_177a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1779);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_175b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_175a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1ba8 = local_1270;
  do {
    local_1ba8 = local_1ba8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1ba8 != local_12f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_173a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1739);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_171c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_171b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1bc0 = local_720;
  do {
    local_1bc0 = local_1bc0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1bc0 != local_a50);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1bd8 = local_1168;
  do {
    local_1bd8 = local_1bd8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1bd8 != local_11f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_16fa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_16f9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_16db);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_16da);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1bf0 = local_1060;
  do {
    local_1bf0 = local_1bf0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1bf0 != local_10e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_16ba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_16b9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_169b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_169a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1c08 = local_b70;
  do {
    local_1c08 = local_1c08 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1c08 != local_ea0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_167a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1679);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_165a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1659);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_163a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1639);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_161a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1619);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15fa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_15d9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15ba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_15b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_159a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1599);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_157a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1579);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe288);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1559);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_153a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1539);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_151a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1519);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe288);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar3 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14ea);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14e9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_14e1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_14c2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_14c1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan estimaterawfee()
{
    return RPCHelpMan{"estimaterawfee",
        "\nWARNING: This interface is unstable and may disappear or change!\n"
        "\nWARNING: This is an advanced API call that is tightly coupled to the specific\n"
        "implementation of fee estimation. The parameters it can be called with\n"
        "and the results it returns will change if the internal implementation changes.\n"
        "\nEstimates the approximate fee per kilobyte needed for a transaction to begin\n"
        "confirmation within conf_target blocks if possible. Uses virtual transaction size as\n"
        "defined in BIP 141 (witness data is discounted).\n",
        {
            {"conf_target", RPCArg::Type::NUM, RPCArg::Optional::NO, "Confirmation target in blocks (1 - 1008)"},
            {"threshold", RPCArg::Type::NUM, RPCArg::Default{0.95}, "The proportion of transactions in a given feerate range that must have been\n"
            "confirmed within conf_target in order to consider those feerates as high enough and proceed to check\n"
            "lower buckets."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "Results are returned for any horizon which tracks blocks up to the confirmation target",
            {
                {RPCResult::Type::OBJ, "short", /*optional=*/true, "estimate for short time horizon",
                    {
                        {RPCResult::Type::NUM, "feerate", /*optional=*/true, "estimate fee rate in " + CURRENCY_UNIT + "/kvB"},
                        {RPCResult::Type::NUM, "decay", "exponential decay (per block) for historical moving average of confirmation data"},
                        {RPCResult::Type::NUM, "scale", "The resolution of confirmation targets at this time horizon"},
                        {RPCResult::Type::OBJ, "pass", /*optional=*/true, "information about the lowest range of feerates to succeed in meeting the threshold",
                        {
                                {RPCResult::Type::NUM, "startrange", "start of feerate range"},
                                {RPCResult::Type::NUM, "endrange", "end of feerate range"},
                                {RPCResult::Type::NUM, "withintarget", "number of txs over history horizon in the feerate range that were confirmed within target"},
                                {RPCResult::Type::NUM, "totalconfirmed", "number of txs over history horizon in the feerate range that were confirmed at any point"},
                                {RPCResult::Type::NUM, "inmempool", "current number of txs in mempool in the feerate range unconfirmed for at least target blocks"},
                                {RPCResult::Type::NUM, "leftmempool", "number of txs over history horizon in the feerate range that left mempool unconfirmed after target"},
                        }},
                        {RPCResult::Type::OBJ, "fail", /*optional=*/true, "information about the highest range of feerates to fail to meet the threshold",
                        {
                            {RPCResult::Type::ELISION, "", ""},
                        }},
                        {RPCResult::Type::ARR, "errors", /*optional=*/true, "Errors encountered during processing (if there are any)",
                        {
                            {RPCResult::Type::STR, "error", ""},
                        }},
                }},
                {RPCResult::Type::OBJ, "medium", /*optional=*/true, "estimate for medium time horizon",
                {
                    {RPCResult::Type::ELISION, "", ""},
                }},
                {RPCResult::Type::OBJ, "long", /*optional=*/true, "estimate for long time horizon",
                {
                    {RPCResult::Type::ELISION, "", ""},
                }},
            }},
        RPCExamples{
            HelpExampleCli("estimaterawfee", "6 0.9")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            CBlockPolicyEstimator& fee_estimator = EnsureAnyFeeEstimator(request.context);
            const NodeContext& node = EnsureAnyNodeContext(request.context);

            CHECK_NONFATAL(node.validation_signals)->SyncWithValidationInterfaceQueue();
            unsigned int max_target = fee_estimator.HighestTargetTracked(FeeEstimateHorizon::LONG_HALFLIFE);
            unsigned int conf_target = ParseConfirmTarget(request.params[0], max_target);
            double threshold = 0.95;
            if (!request.params[1].isNull()) {
                threshold = request.params[1].get_real();
            }
            if (threshold < 0 || threshold > 1) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid threshold");
            }

            UniValue result(UniValue::VOBJ);

            for (const FeeEstimateHorizon horizon : ALL_FEE_ESTIMATE_HORIZONS) {
                CFeeRate feeRate;
                EstimationResult buckets;

                // Only output results for horizons which track the target
                if (conf_target > fee_estimator.HighestTargetTracked(horizon)) continue;

                feeRate = fee_estimator.estimateRawFee(conf_target, threshold, horizon, &buckets);
                UniValue horizon_result(UniValue::VOBJ);
                UniValue errors(UniValue::VARR);
                UniValue passbucket(UniValue::VOBJ);
                passbucket.pushKV("startrange", round(buckets.pass.start));
                passbucket.pushKV("endrange", round(buckets.pass.end));
                passbucket.pushKV("withintarget", round(buckets.pass.withinTarget * 100.0) / 100.0);
                passbucket.pushKV("totalconfirmed", round(buckets.pass.totalConfirmed * 100.0) / 100.0);
                passbucket.pushKV("inmempool", round(buckets.pass.inMempool * 100.0) / 100.0);
                passbucket.pushKV("leftmempool", round(buckets.pass.leftMempool * 100.0) / 100.0);
                UniValue failbucket(UniValue::VOBJ);
                failbucket.pushKV("startrange", round(buckets.fail.start));
                failbucket.pushKV("endrange", round(buckets.fail.end));
                failbucket.pushKV("withintarget", round(buckets.fail.withinTarget * 100.0) / 100.0);
                failbucket.pushKV("totalconfirmed", round(buckets.fail.totalConfirmed * 100.0) / 100.0);
                failbucket.pushKV("inmempool", round(buckets.fail.inMempool * 100.0) / 100.0);
                failbucket.pushKV("leftmempool", round(buckets.fail.leftMempool * 100.0) / 100.0);

                // CFeeRate(0) is used to indicate error as a return value from estimateRawFee
                if (feeRate != CFeeRate(0)) {
                    horizon_result.pushKV("feerate", ValueFromAmount(feeRate.GetFeePerK()));
                    horizon_result.pushKV("decay", buckets.decay);
                    horizon_result.pushKV("scale", (int)buckets.scale);
                    horizon_result.pushKV("pass", std::move(passbucket));
                    // buckets.fail.start == -1 indicates that all buckets passed, there is no fail bucket to output
                    if (buckets.fail.start != -1) horizon_result.pushKV("fail", std::move(failbucket));
                } else {
                    // Output only information that is still meaningful in the event of error
                    horizon_result.pushKV("decay", buckets.decay);
                    horizon_result.pushKV("scale", (int)buckets.scale);
                    horizon_result.pushKV("fail", std::move(failbucket));
                    errors.push_back("Insufficient data or no feerate found which meets threshold");
                    horizon_result.pushKV("errors", std::move(errors));
                }
                result.pushKV(StringForFeeEstimateHorizon(horizon), std::move(horizon_result));
            }
            return result;
        },
    };
}